

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O0

ostream * deqp::ub::operator<<(ostream *str,PrecisionFlagsFmt *fmt)

{
  char *local_30;
  char *local_28;
  PrecisionFlagsFmt *fmt_local;
  ostream *str_local;
  
  if ((fmt->flags & 1) == 0) {
    if ((fmt->flags & 2) == 0) {
      local_30 = "";
      if ((fmt->flags & 4) != 0) {
        local_30 = "highp";
      }
    }
    else {
      local_30 = "mediump";
    }
    local_28 = local_30;
  }
  else {
    local_28 = "lowp";
  }
  std::operator<<(str,local_28);
  return str;
}

Assistant:

std::ostream& operator<<(std::ostream& str, const PrecisionFlagsFmt& fmt)
{
	// Precision.
	DE_ASSERT(dePop32(fmt.flags & (PRECISION_LOW | PRECISION_MEDIUM | PRECISION_HIGH)) <= 1);
	str << (fmt.flags & PRECISION_LOW ?
				"lowp" :
				fmt.flags & PRECISION_MEDIUM ? "mediump" : fmt.flags & PRECISION_HIGH ? "highp" : "");
	return str;
}